

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
alloc_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable)

{
  exr_result_t eVar1;
  uint64_t *__s;
  uint64_t *puVar2;
  size_t __n;
  bool bVar3;
  
  __s = (uint64_t *)part->chunk_table;
  if ((uint64_t *)part->chunk_table == (uint64_t *)0x0) {
    __n = (long)part->chunk_count << 3;
    __s = (uint64_t *)(*ctxt->alloc_fn)(__n);
    if (__s == (uint64_t *)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,1);
      return eVar1;
    }
    memset(__s,0,__n);
    LOCK();
    puVar2 = (uint64_t *)part->chunk_table;
    bVar3 = puVar2 == (uint64_t *)0x0;
    if (bVar3) {
      part->chunk_table = (atomic_uintptr_t)__s;
      puVar2 = (uint64_t *)0x0;
    }
    UNLOCK();
    if (!bVar3) {
      (*ctxt->free_fn)(__s);
      __s = puVar2;
    }
  }
  *chunktable = __s;
  return 0;
}

Assistant:

static exr_result_t
alloc_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable)
{
    uint64_t* ctable = NULL;

    /* we have the lock, but to access the type, we'll use the atomic function anyway */
#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif

    if (ctable == NULL)
    {
        uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;
        uintptr_t eptr = 0, nptr = 0;

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (ctable, 0, chunkbytes);

        nptr = (uintptr_t) ctable;
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }
    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}